

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Totals * __thiscall Catch::Totals::operator+=(Totals *this,Totals *other)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  
  uVar1 = (other->assertions).failed;
  uVar2 = (this->testCases).passed;
  uVar3 = (this->testCases).failed;
  uVar4 = (this->testCases).failedButOk;
  uVar5 = (this->testCases).skipped;
  (this->assertions).passed = (this->assertions).passed + (other->assertions).passed;
  (this->assertions).failed = (this->assertions).failed + uVar1;
  uVar1 = (other->assertions).skipped;
  (this->assertions).failedButOk = (other->assertions).failedButOk + (this->assertions).failedButOk;
  (this->assertions).skipped = uVar1 + (this->assertions).skipped;
  uVar1 = (other->testCases).failed;
  (this->testCases).passed = (other->testCases).passed + uVar2;
  (this->testCases).failed = uVar1 + uVar3;
  uVar1 = (other->testCases).skipped;
  (this->testCases).failedButOk = (other->testCases).failedButOk + uVar4;
  (this->testCases).skipped = uVar1 + uVar5;
  return this;
}

Assistant:

Totals& Totals::operator += ( Totals const& other ) {
        assertions += other.assertions;
        testCases += other.testCases;
        return *this;
    }